

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbarinfo_commands.cpp
# Opt level: O2

void __thiscall CommandDrawNumber::CommandDrawNumber(CommandDrawNumber *this,SBarInfo *script)

{
  CommandDrawString::CommandDrawString(&this->super_CommandDrawString,script);
  (this->super_CommandDrawString).super_SBarInfoCommand._vptr_SBarInfoCommand =
       (_func_int **)&PTR__CommandDrawNumber_00702978;
  *(undefined8 *)&(this->super_CommandDrawString).field_0x5c = 0;
  this->drawValue = 0;
  this->length = 3;
  this->lowValue = -1;
  this->lowTranslation = CR_UNTRANSLATED;
  this->highValue = -1;
  this->highTranslation = CR_UNTRANSLATED;
  this->value = CONSTANT;
  this->inventoryItem = (PClassActor *)0x0;
  (this->prefixPadding).Chars = FString::NullString.Nothing;
  FString::NullString.RefCount = FString::NullString.RefCount + 1;
  FString::FString(&this->cvarName,(char *)0x0);
  return;
}

Assistant:

CommandDrawNumber(SBarInfo *script) : CommandDrawString(script),
			fillZeros(false), whenNotZero(false), dontCap(false),
			usePrefix(false), interpolationSpeed(0), drawValue(0), length(3),
			lowValue(-1), lowTranslation(CR_UNTRANSLATED), highValue(-1),
			highTranslation(CR_UNTRANSLATED), value(CONSTANT),
			inventoryItem(NULL), cvarName(nullptr)
		{
		}